

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::unprotect_reasons(Internal *this)

{
  Clause *pCVar1;
  bool bVar2;
  Var *pVVar3;
  Internal *in_RDI;
  Clause *reason;
  Var *v;
  int *lit;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = &in_RDI->trail;
  local_18._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
        , bVar2) {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_18);
    bVar2 = active(in_RDI,in_stack_ffffffffffffffbc);
    if (bVar2) {
      pVVar3 = var(in_RDI,in_stack_ffffffffffffffbc);
      pCVar1 = pVVar3->reason;
      if ((pCVar1 != (Clause *)0x0) && (pCVar1 != in_RDI->external_reason)) {
        *(uint *)&pCVar1->field_0x8 = *(uint *)&pCVar1->field_0x8 & 0xfffffbff;
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_18);
  }
  in_RDI->protected_reasons = false;
  return;
}

Assistant:

void Internal::unprotect_reasons () {
  LOG ("unprotecting reasons clauses of all assigned variables on trail");
  assert (protected_reasons);
#ifdef LOGGING
  size_t count = 0;
#endif
  for (const auto &lit : trail) {
    if (!active (lit))
      continue;
    assert (val (lit));
    Var &v = var (lit);
    assert (v.level > 0);
    Clause *reason = v.reason;
    if (!reason)
      continue;
    if (reason == external_reason)
      continue;
    LOG (reason, "unprotecting assigned %d reason %p", lit,
         (void *) reason);
    assert (reason->reason);
    reason->reason = false;
#ifdef LOGGING
    count++;
#endif
  }
  LOG ("unprotected %zd reason clauses referenced on trail", count);
  protected_reasons = false;
}